

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-io.c
# Opt level: O3

void init_handles(void)

{
  err_fh = _stderr;
  g_set_printerr_handler(_local_printerr);
  out_fh = _stdout;
  g_set_print_handler(_local_printout);
  return;
}

Assistant:

void
init_handles   (void)
{
#ifdef G_OS_WIN32
    if (! init_wincon_handle (false))
#endif
        err_fh = stderr;
    g_set_printerr_handler (_local_printerr);

#ifdef G_OS_WIN32
    if (! init_wincon_handle (true))
#endif
        out_fh = stdout;
    g_set_print_handler (_local_printout);
}